

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p)

{
  bool bVar1;
  uchar *p_00;
  XMLAttribute *this_00;
  char *pcVar2;
  XMLAttribute **ppXVar3;
  XMLDocument *pXVar4;
  XMLAttribute *pXVar5;
  
  pXVar5 = (XMLAttribute *)0x0;
  p_00 = (uchar *)p;
  while( true ) {
    if (p_00 == (uchar *)0x0) {
      return (char *)0x0;
    }
    p_00 = (uchar *)XMLUtil::SkipWhiteSpace((char *)p_00);
    if (*p_00 == '\0') {
      pXVar4 = (this->super_XMLNode)._document;
      pcVar2 = XMLNode::Value(&this->super_XMLNode);
      pXVar4->_errorID = XML_ERROR_PARSING_ELEMENT;
      pXVar4->_errorStr1 = p;
      pXVar4->_errorStr2 = pcVar2;
      return (char *)0x0;
    }
    bVar1 = XMLUtil::IsNameStartChar(*p_00);
    if (!bVar1) {
      if (*p_00 == '/') {
        if (p_00[1] == '>') {
          this->_closingType = 1;
          return (char *)(p_00 + 2);
        }
      }
      else if (*p_00 == '>') {
        return (char *)(p_00 + 1);
      }
      pXVar4 = (this->super_XMLNode)._document;
      pXVar4->_errorID = XML_ERROR_PARSING_ELEMENT;
      goto LAB_001937ed;
    }
    this_00 = (XMLAttribute *)
              MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
    this_00->_vptr_XMLAttribute = (_func_int **)&PTR__XMLAttribute_002a02f0;
    (this_00->_name)._flags = 0;
    (this_00->_name)._start = (char *)0x0;
    (this_00->_name)._end = (char *)0x0;
    (this_00->_value)._flags = 0;
    *(undefined1 (*) [32])&(this_00->_value)._start = ZEXT432(0) << 0x40;
    pXVar4 = (this->super_XMLNode)._document;
    this_00->_memPool = &(pXVar4->_attributePool).super_MemPool;
    (*(pXVar4->_attributePool).super_MemPool._vptr_MemPool[5])();
    p_00 = (uchar *)XMLAttribute::ParseDeep
                              (this_00,(char *)p_00,
                               ((this->super_XMLNode)._document)->_processEntities);
    if (p_00 == (uchar *)0x0) break;
    pcVar2 = StrPair::GetStr(&this_00->_name);
    pcVar2 = Attribute(this,pcVar2,(char *)0x0);
    if (pcVar2 != (char *)0x0) break;
    ppXVar3 = &pXVar5->_next;
    if (pXVar5 == (XMLAttribute *)0x0) {
      ppXVar3 = &this->_rootAttribute;
    }
    *ppXVar3 = this_00;
    pXVar5 = this_00;
  }
  DeleteAttribute(this_00);
  pXVar4 = (this->super_XMLNode)._document;
  pXVar4->_errorID = XML_ERROR_PARSING_ATTRIBUTE;
LAB_001937ed:
  pXVar4->_errorStr1 = p;
  pXVar4->_errorStr2 = (char *)p_00;
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name() );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
            XMLAttribute* attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
            attrib->_memPool = &_document->_attributePool;
			attrib->_memPool->SetTracked();

            p = attrib->ParseDeep( p, _document->ProcessEntities() );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                prevAttribute->_next = attrib;
            }
            else {
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p );
            return 0;
        }
    }
    return p;
}